

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modl.c
# Opt level: O3

void show_options(char **argv)

{
  fwrite("Source to source compiler from NMODL to C\n",0x2a,1,_stderr);
  fprintf(_stderr,"Usage: %s [options] Inputfile\n",*argv);
  fwrite("Options:\n",9,1,_stderr);
  fwrite("\t-o | --outdir <OUTPUT_DIRECTORY>    directory where output files will be written\n",0x52
         ,1,_stderr);
  fwrite("\t-h | --help                         print this message\n",0x38,1,_stderr);
  fwrite("\t-v | --version                      print version number\n",0x3a,1,_stderr);
  return;
}

Assistant:

static void show_options(char** argv) {
  fprintf(stderr, "Source to source compiler from NMODL to C\n");
  fprintf(stderr, "Usage: %s [options] Inputfile\n", argv[0]);
  fprintf(stderr, "Options:\n");
  fprintf(stderr, "\t-o | --outdir <OUTPUT_DIRECTORY>    directory where output files will be written\n");
  fprintf(stderr, "\t-h | --help                         print this message\n");
  fprintf(stderr, "\t-v | --version                      print version number\n");
}